

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall
CCommandLineOptions::SetByCommandLineArguments
          (CCommandLineOptions *this,int numberOfArguments,char **arguments)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  allocator local_59;
  char **local_58;
  string local_50;
  
  local_58 = arguments;
  ResetDefaults(this);
  this->optionsEnd = false;
  uVar2 = 0;
  uVar3 = (ulong)(uint)numberOfArguments;
  if (numberOfArguments < 1) {
    uVar3 = uVar2;
  }
  while( true ) {
    if (uVar3 == uVar2) {
      return true;
    }
    std::__cxx11::string::string((string *)&local_50,local_58[uVar2],&local_59);
    bVar1 = parseArgument(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar1) break;
    uVar2 = uVar2 + 1;
    if (this->isInfoOnly == true) {
      return true;
    }
  }
  ResetDefaults(this);
  return false;
}

Assistant:

bool CCommandLineOptions::SetByCommandLineArguments( int numberOfArguments,
	const char* const arguments[] )
{
	ResetDefaults();
	optionsEnd = false;
	for( int i = 0; i < numberOfArguments; i++ ) {
		if( !parseArgument( arguments[i] ) ) {
			ResetDefaults();
			return false;
		}
		if( IsInfoOnly() ) {
			break;
		}
	}
	return true;
}